

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles3::Functional::TextureSizeCase::iterate(TextureSizeCase *this)

{
  int iVar1;
  TestContext *this_00;
  bool bVar2;
  IterateResult IVar3;
  undefined1 local_498 [16];
  undefined8 local_488;
  undefined1 *puStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined1 *puStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined1 *puStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined1 *puStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined1 *puStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined1 *puStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined1 *puStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined1 *puStack_140;
  undefined1 *local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined1 *puStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  iVar1 = this->m_iterationCounter;
  this->m_iterationCounter = iVar1 + 1;
  local_498._0_8_ = 0x200000001;
  local_498._8_8_ = &DAT_100000001;
  local_488 = 0x100000000;
  puStack_480 = &DAT_100000001;
  local_478 = 0x200000001;
  uStack_470 = 1;
  local_468 = 0x100000000;
  uStack_460 = 0x100000002;
  local_458 = 0x300000001;
  uStack_450 = 2;
  local_448 = 0x100000000;
  uStack_440 = 0x200000003;
  local_438 = 0x300000001;
  uStack_430 = 0x100000002;
  local_428 = 0x100000000;
  puStack_420 = &DAT_100000001;
  local_418 = 0x1f00000064;
  uStack_410 = 0x12;
  local_408 = 0x6400000000;
  uStack_400 = 0x120000001f;
  local_3f8 = 0x1f00000064;
  uStack_3f0 = 0x100000012;
  local_3e8 = 0x3200000000;
  uStack_3e0 = 0x90000000f;
  local_3d8 = 0x1f00000064;
  uStack_3d0 = 0x200000012;
  local_3c8 = 0x1900000000;
  uStack_3c0 = 0x400000007;
  local_3b8 = 0x1f00000064;
  uStack_3b0 = 0x300000012;
  local_3a8 = 0xc00000000;
  uStack_3a0 = 0x200000003;
  local_398 = 0x1f00000064;
  uStack_390 = 0x400000012;
  local_388 = 0x600000000;
  puStack_380 = &DAT_100000001;
  local_378 = 0x1f00000064;
  uStack_370 = 0x500000012;
  local_368 = 0x300000000;
  puStack_360 = &DAT_100000001;
  local_358 = 0x1f00000064;
  uStack_350 = 0x600000012;
  local_348 = 0x100000000;
  puStack_340 = &DAT_100000001;
  local_338 = 0x8000000064;
  uStack_330 = 0x20;
  local_328 = 0x6400000000;
  uStack_320 = 0x2000000080;
  local_318 = 0x8000000064;
  uStack_310 = 0x100000020;
  local_308 = 0x3200000000;
  uStack_300 = 0x1000000040;
  local_2f8 = 0x8000000064;
  uStack_2f0 = 0x200000020;
  local_2e8 = 0x1900000000;
  uStack_2e0 = 0x800000020;
  local_2d8 = 0x8000000064;
  uStack_2d0 = 0x300000020;
  local_2c8 = 0xc00000000;
  uStack_2c0 = 0x400000010;
  local_2b8 = 0x8000000064;
  uStack_2b0 = 0x400000020;
  local_2a8 = 0x600000000;
  uStack_2a0 = 0x200000008;
  local_298 = 0x8000000064;
  uStack_290 = 0x500000020;
  local_288 = 0x300000000;
  uStack_280 = 0x100000004;
  local_278 = 0x8000000064;
  uStack_270 = 0x600000020;
  local_268 = 0x100000000;
  uStack_260 = 0x100000002;
  local_258 = 0x8000000064;
  uStack_250 = 0x700000020;
  local_248 = 0x100000000;
  puStack_240 = &DAT_100000001;
  local_238 = 0x4000000080;
  uStack_230 = 0x20;
  local_228 = 0x8000000000;
  uStack_220 = 0x2000000040;
  local_218 = 0x4000000080;
  uStack_210 = 0x100000020;
  local_208 = 0x4000000000;
  uStack_200 = 0x1000000020;
  local_1f8 = 0x4000000080;
  uStack_1f0 = 0x200000020;
  local_1e8 = 0x2000000000;
  uStack_1e0 = 0x800000010;
  local_1d8 = 0x4000000080;
  uStack_1d0 = 0x300000020;
  local_1c8 = 0x1000000000;
  uStack_1c0 = 0x400000008;
  local_1b8 = 0x4000000080;
  uStack_1b0 = 0x400000020;
  local_1a8 = 0x800000000;
  uStack_1a0 = 0x200000004;
  local_198 = 0x4000000080;
  uStack_190 = 0x500000020;
  local_188 = 0x400000000;
  uStack_180 = 0x100000002;
  local_178 = 0x4000000080;
  uStack_170 = 0x600000020;
  local_168 = 0x200000000;
  puStack_160 = &DAT_100000001;
  local_158 = 0x4000000080;
  uStack_150 = 0x700000020;
  local_148 = 0x100000000;
  puStack_140 = &DAT_100000001;
  local_138 = &DAT_100000001;
  uStack_130 = 1;
  local_128 = 0x100000000;
  puStack_120 = &DAT_100000001;
  local_118 = 0x4000000040;
  uStack_110 = 0x40;
  local_108 = 0x4000000000;
  uStack_100 = 0x4000000040;
  local_f8 = 0x4000000040;
  uStack_f0 = 0x100000040;
  local_e8 = 0x2000000000;
  uStack_e0 = 0x2000000020;
  local_d8 = 0x4000000040;
  uStack_d0 = 0x200000040;
  local_c8 = 0x1000000000;
  uStack_c0 = 0x1000000010;
  local_b8 = 0x4000000040;
  uStack_b0 = 0x300000040;
  local_a8 = 0x800000000;
  uStack_a0 = 0x800000008;
  local_98 = 0x4000000040;
  uStack_90 = 0x400000040;
  local_88 = 0x400000000;
  uStack_80 = 0x400000004;
  local_78 = 0x1f00000064;
  uStack_70 = 0x300000012;
  local_68 = &DAT_600000001;
  puStack_60 = &DAT_100000001;
  local_58 = 0x4000000080;
  uStack_50 = 0x300000020;
  local_48 = 0x800000001;
  uStack_40 = 0x200000004;
  local_38 = 0x4000000040;
  uStack_30 = 0x100000040;
  local_28 = 0x1000000001;
  uStack_20 = 0x1000000010;
  if (iVar1 == 0x25) {
    freeShader(this);
    IVar3 = STOP;
  }
  else if (iVar1 == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    bVar2 = initShader(this);
    IVar3 = (IterateResult)bVar2;
  }
  else {
    bVar2 = testTextureSize(this,(TestSize *)(local_498 + (long)(iVar1 + -1) * 0x20));
    IVar3 = CONTINUE;
    if ((!bVar2) &&
       (this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
       this_00->m_testResult != QP_TEST_RESULT_FAIL)) {
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,"Got unexpected texture size");
    }
  }
  return IVar3;
}

Assistant:

TestCase::IterateResult TextureSizeCase::iterate (void)
{
	const int currentIteration = m_iterationCounter++;
	const TestSize testSizes[] =
	{
		{ tcu::IVec3(1, 2, 1),			1,		0,	tcu::IVec3(1, 1, 1)			},
		{ tcu::IVec3(1, 2, 1),			0,		0,	tcu::IVec3(1, 2, 1)			},

		{ tcu::IVec3(1, 3, 2),			0,		0,	tcu::IVec3(1, 3, 2)			},
		{ tcu::IVec3(1, 3, 2),			1,		0,	tcu::IVec3(1, 1, 1)			},

		{ tcu::IVec3(100, 31, 18),		0,		0,	tcu::IVec3(100, 31, 18)		},
		{ tcu::IVec3(100, 31, 18),		1,		0,	tcu::IVec3(50, 15, 9)		},
		{ tcu::IVec3(100, 31, 18),		2,		0,	tcu::IVec3(25, 7, 4)		},
		{ tcu::IVec3(100, 31, 18),		3,		0,	tcu::IVec3(12, 3, 2)		},
		{ tcu::IVec3(100, 31, 18),		4,		0,	tcu::IVec3(6, 1, 1)			},
		{ tcu::IVec3(100, 31, 18),		5,		0,	tcu::IVec3(3, 1, 1)			},
		{ tcu::IVec3(100, 31, 18),		6,		0,	tcu::IVec3(1, 1, 1)			},

		{ tcu::IVec3(100, 128, 32),		0,		0,	tcu::IVec3(100, 128, 32)	},
		{ tcu::IVec3(100, 128, 32),		1,		0,	tcu::IVec3(50, 64, 16)		},
		{ tcu::IVec3(100, 128, 32),		2,		0,	tcu::IVec3(25, 32, 8)		},
		{ tcu::IVec3(100, 128, 32),		3,		0,	tcu::IVec3(12, 16, 4)		},
		{ tcu::IVec3(100, 128, 32),		4,		0,	tcu::IVec3(6, 8, 2)			},
		{ tcu::IVec3(100, 128, 32),		5,		0,	tcu::IVec3(3, 4, 1)			},
		{ tcu::IVec3(100, 128, 32),		6,		0,	tcu::IVec3(1, 2, 1)			},
		{ tcu::IVec3(100, 128, 32),		7,		0,	tcu::IVec3(1, 1, 1)			},

		// pow 2
		{ tcu::IVec3(128, 64, 32),		0,		0,	tcu::IVec3(128, 64, 32)		},
		{ tcu::IVec3(128, 64, 32),		1,		0,	tcu::IVec3(64, 32, 16)		},
		{ tcu::IVec3(128, 64, 32),		2,		0,	tcu::IVec3(32, 16, 8)		},
		{ tcu::IVec3(128, 64, 32),		3,		0,	tcu::IVec3(16, 8, 4)		},
		{ tcu::IVec3(128, 64, 32),		4,		0,	tcu::IVec3(8, 4, 2)			},
		{ tcu::IVec3(128, 64, 32),		5,		0,	tcu::IVec3(4, 2, 1)			},
		{ tcu::IVec3(128, 64, 32),		6,		0,	tcu::IVec3(2, 1, 1)			},
		{ tcu::IVec3(128, 64, 32),		7,		0,	tcu::IVec3(1, 1, 1)			},

		// w == h
		{ tcu::IVec3(1, 1, 1),			0,		0,	tcu::IVec3(1, 1, 1)			},
		{ tcu::IVec3(64, 64, 64),		0,		0,	tcu::IVec3(64, 64, 64)		},
		{ tcu::IVec3(64, 64, 64),		1,		0,	tcu::IVec3(32, 32, 32)		},
		{ tcu::IVec3(64, 64, 64),		2,		0,	tcu::IVec3(16, 16, 16)		},
		{ tcu::IVec3(64, 64, 64),		3,		0,	tcu::IVec3(8, 8, 8)			},
		{ tcu::IVec3(64, 64, 64),		4,		0,	tcu::IVec3(4, 4, 4)			},

		// with lod base
		{ tcu::IVec3(100, 31, 18),		3,		1,	tcu::IVec3(6, 1, 1)			},
		{ tcu::IVec3(128, 64, 32),		3,		1,	tcu::IVec3(8, 4, 2)			},
		{ tcu::IVec3(64, 64, 64),		1,		1,	tcu::IVec3(16, 16, 16)		},

	};
	const int lastIterationIndex = DE_LENGTH_OF_ARRAY(testSizes) + 1;

	if (currentIteration == 0)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return initShader() ? CONTINUE : STOP;
	}
	else if (currentIteration == lastIterationIndex)
	{
		freeShader();
		return STOP;
	}
	else
	{
		if (!testTextureSize(testSizes[currentIteration - 1]))
			if (m_testCtx.getTestResult() != QP_TEST_RESULT_FAIL)
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got unexpected texture size");
		return CONTINUE;
	}
}